

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluDrawUtil.cpp
# Opt level: O0

void glu::drawFromVAOBuffers
               (RenderContext *context,deUint32 program,int numVertexArrays,
               VertexArrayBinding *vertexArrays,PrimitiveList *primitives,DrawUtilCallback *callback
               )

{
  code *pcVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  undefined1 local_50 [8];
  VertexArray vao;
  Functions *gl;
  DrawUtilCallback *callback_local;
  PrimitiveList *primitives_local;
  VertexArrayBinding *vertexArrays_local;
  int numVertexArrays_local;
  deUint32 program_local;
  RenderContext *context_local;
  
  vao.super_ObjectWrapper.m_object = (*context->_vptr_RenderContext[3])();
  vao.super_ObjectWrapper._20_4_ = extraout_var;
  TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)local_50,context);
  pcVar1 = *(code **)(vao.super_ObjectWrapper._16_8_ + 0xd8);
  dVar2 = ObjectWrapper::operator*((ObjectWrapper *)local_50);
  (*pcVar1)(dVar2);
  drawFromBuffers(context,program,numVertexArrays,vertexArrays,primitives,callback);
  (**(code **)(vao.super_ObjectWrapper._16_8_ + 0xd8))(0);
  TypedObjectWrapper<(glu::ObjectType)5>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)local_50);
  return;
}

Assistant:

void drawFromVAOBuffers (const RenderContext& context, deUint32 program, int numVertexArrays, const VertexArrayBinding* vertexArrays, const PrimitiveList& primitives, DrawUtilCallback* callback)
{
	const glw::Functions&	gl		= context.getFunctions();
	VertexArray				vao		(context);

	gl.bindVertexArray(*vao);
	drawFromBuffers(context, program, numVertexArrays, vertexArrays, primitives, callback);
	gl.bindVertexArray(0);
}